

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darts.h
# Opt level: O2

void __thiscall Darts::Details::BitVector::build(BitVector *this)

{
  id_type iVar1;
  uint *array;
  size_t sVar2;
  size_t i;
  ulong uVar3;
  
  uVar3 = (this->units_).size_;
  array = (uint *)operator_new__(-(ulong)(uVar3 >> 0x3e != 0) | uVar3 << 2);
  AutoArray<unsigned_int>::reset(&this->ranks_,array);
  this->num_ones_ = 0;
  sVar2 = 0;
  for (uVar3 = 0; uVar3 < (this->units_).size_; uVar3 = uVar3 + 1) {
    (this->ranks_).array_[uVar3] = (uint)sVar2;
    iVar1 = pop_count(*(id_type *)((this->units_).buf_.array_ + uVar3 * 4));
    sVar2 = (ulong)iVar1 + this->num_ones_;
    this->num_ones_ = sVar2;
  }
  return;
}

Assistant:

inline void BitVector::build() {
  try {
    ranks_.reset(new id_type[units_.size()]);
  } catch (const std::bad_alloc &) {
    DARTS_THROW("failed to build rank index: std::bad_alloc");
  }

  num_ones_ = 0;
  for (std::size_t i = 0; i < units_.size(); ++i) {
    ranks_[i] = num_ones_;
    num_ones_ += pop_count(units_[i]);
  }
}